

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O2

string * __thiscall
FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,std::less<boost::shared_ptr<PartialJPDPValuePair>>>
::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  long *plVar2;
  stringstream ss;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  plVar2 = (long *)this;
  while (plVar2 = (long *)*plVar2, plVar2 != (long *)this) {
    poVar1 = std::operator<<(local_1a8,"FixedCapacityPriorityQueue item number ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    (**(code **)(*(long *)plVar2[2] + 0x78))(local_1d8);
    poVar1 = std::operator<<(local_1a8,local_1d8);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string SoftPrint() const
        {
            std::stringstream ss;
            size_t i=0;
            typename std::list<T>::const_iterator it = _m_l.begin();
            while(it!=_m_l.end())
            {
                ss << "FixedCapacityPriorityQueue item number " << i << std::endl;
                ss << (*it)->SoftPrint() << std::endl;
                it++;
                i++;
            }
            return(ss.str());
        }